

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS ref_gather_metric(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_MPI pRVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  REF_STATUS RVar6;
  FILE *__stream;
  ulong uVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  undefined8 uVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  REF_STATUS ref_private_macro_code_rxs_1;
  void *pvVar20;
  char *pcVar21;
  size_t unaff_R12;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rxs;
  ulong uVar22;
  REF_DBL *pRVar23;
  bool bVar24;
  double dVar25;
  ulong uStackY_e0;
  long local_90;
  REF_INT local;
  uint local_80;
  REF_INT keyword_code;
  REF_BOOL met_format;
  REF_BOOL solb_format;
  size_t local_70;
  ulong local_68;
  ulong local_60;
  uint local_54;
  ulong local_50;
  REF_GRID local_48;
  long local_40;
  REF_INT code;
  
  pRVar1 = ref_grid->node;
  solb_format = 0;
  met_format = 0;
  uVar3 = ref_node_synchronize_globals(pRVar1);
  if (uVar3 != 0) {
    uStackY_e0 = (ulong)uVar3;
    pcVar21 = "sync";
    uVar16 = 0xbac;
    goto LAB_00134fa6;
  }
  if (ref_grid->mpi->id == 0) {
    __stream = fopen(filename,"w");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xbb2,"ref_gather_metric","unable to open file");
      return 2;
    }
    uStackY_e0 = strlen(filename);
    if (uStackY_e0 < 6) {
      if (uStackY_e0 != 5) goto LAB_00133fb6;
    }
    else {
      iVar4 = strcmp(filename + (uStackY_e0 - 5),".solb");
      if (iVar4 == 0) {
        solb_format = 1;
      }
    }
    iVar4 = strcmp(filename + (uStackY_e0 - 4),".met");
    if (iVar4 == 0) {
      met_format = 1;
    }
  }
  else {
    __stream = (FILE *)0x0;
    uStackY_e0 = unaff_R12;
  }
LAB_00133fb6:
  uVar3 = ref_mpi_all_or(ref_grid->mpi,&solb_format);
  if (uVar3 != 0) {
    uStackY_e0 = (ulong)uVar3;
    pcVar21 = "bcast";
    uVar16 = 0xbba;
    goto LAB_00134fa6;
  }
  uVar3 = ref_mpi_all_or(ref_grid->mpi,&met_format);
  if (uVar3 != 0) {
    uStackY_e0 = (ulong)uVar3;
    pcVar21 = "bcast";
    uVar16 = 0xbbb;
    goto LAB_00134fa6;
  }
  if (solb_format != 0) {
    pRVar2 = ref_grid->mpi;
    pRVar1 = ref_grid->node;
    uVar3 = ref_node_synchronize_globals(pRVar1);
    if (uVar3 != 0) {
      uStackY_e0 = (ulong)uVar3;
      pcVar21 = "sync";
      uVar16 = 0x586;
      goto LAB_0013410b;
    }
    bVar24 = ref_grid->twod == 0;
    lVar11 = 0x18;
    if (bVar24) {
      lVar11 = 0x30;
    }
    local_54 = bVar24 | 2;
    local_80 = 2;
    uVar3 = ref_grid->meshb_version;
    if ((int)uVar3 < 2) {
      if (pRVar1->old_n_global < 0x989681) {
        uVar10 = 8;
        bVar24 = true;
      }
      else {
        bVar24 = (ulong)pRVar1->old_n_global < 0xbebc201;
        local_80 = 4 - bVar24;
        uVar10 = 0xc;
      }
    }
    else {
      bVar24 = uVar3 < 4;
      uVar10 = (ulong)((uint)(uVar3 != 2) * 4 + 8);
      local_80 = uVar3;
    }
    if (pRVar2->id != 0) {
      sVar18 = 0;
      uVar3 = local_80;
      goto LAB_001347ab;
    }
    code = 1;
    sVar12 = fwrite(&code,4,1,__stream);
    if (sVar12 == 1) {
      sVar12 = fwrite(&local_80,4,1,__stream);
      if (sVar12 != 1) {
        pcVar21 = "version";
        uStackY_e0 = 1;
        uVar16 = 0x5a0;
        goto LAB_00134f7a;
      }
      lVar13 = ftell(__stream);
      keyword_code = 3;
      sVar12 = fwrite(&keyword_code,4,1,__stream);
      uVar3 = local_80;
      if (sVar12 != 1) {
        pcVar21 = "dim code";
        uStackY_e0 = 1;
        uVar16 = 0x5a3;
        goto LAB_00134f7a;
      }
      local_70 = uVar10 + lVar13 + 4;
      uVar15 = ref_export_meshb_next_position((FILE *)__stream,local_80,local_70);
      if (uVar15 != 0) {
        uStackY_e0 = (ulong)uVar15;
        pcVar21 = "next p";
        uVar16 = 0x5a4;
        goto LAB_0013410b;
      }
      sVar12 = fwrite(&local_54,4,1,__stream);
      if (sVar12 != 1) {
        pcVar21 = "dim";
        uStackY_e0 = 1;
        uVar16 = 0x5a5;
        goto LAB_00134f7a;
      }
      sVar12 = ftell(__stream);
      if (local_70 != sVar12) {
        pcVar21 = "dim inconsistent";
        uVar16 = 0x5a6;
        uStackY_e0 = local_70;
        goto LAB_00134f7a;
      }
      sVar18 = local_70;
      if (pRVar2->id != 0) {
LAB_001347ab:
        lVar11 = pRVar1->old_n_global;
        uVar15 = (int)(lVar11 / (long)pRVar2->n) + 1;
        uVar10 = 0x7fffffff;
        if (0 < pRVar2->reduce_byte_limit) {
          uVar10 = (ulong)(uint)pRVar2->reduce_byte_limit / 0x38;
        }
        if (((int)uVar10 <= (int)uVar15) || (uVar10 = (ulong)uVar15, -1 < (int)uVar15)) {
          local_60 = (ulong)(uint)((int)uVar10 * 7);
          sVar12 = local_60 * 8;
          pvVar8 = malloc(sVar12);
          if (pvVar8 == (void *)0x0) {
            pcVar21 = "malloc local_xyzm of REF_DBL NULL";
            uVar16 = 0x5bd;
          }
          else {
            pvVar9 = malloc(sVar12);
            uVar15 = local_54;
            if (pvVar9 != (void *)0x0) {
              uStackY_e0 = 0;
              local_68 = CONCAT44(local_68._4_4_,(int)uVar10);
              local_90 = 0;
              local_70 = sVar18;
              local_50 = uVar10;
              while (sVar18 = local_70, uVar22 = lVar11 - local_90,
                    uVar22 != 0 && local_90 <= lVar11) {
                uVar17 = uVar22 & 0xffffffff;
                if ((long)local_50 < (long)uVar22) {
                  uVar17 = uVar10;
                }
                for (uVar10 = 0; local_60 != uVar10; uVar10 = uVar10 + 1) {
                  *(undefined8 *)((long)pvVar8 + uVar10 * 8) = 0;
                }
                iVar4 = (int)uVar17;
                local_40 = local_90 + iVar4;
                uVar22 = 0;
                if (0 < iVar4) {
                  uVar22 = uVar17;
                }
                pvVar20 = pvVar8;
                for (uVar10 = 0; uVar10 != uVar22; uVar10 = uVar10 + 1) {
                  uVar5 = ref_node_local(pRVar1,local_90 + uVar10,&local);
                  if ((uVar5 != 0) && (uVar5 != 5)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x5ce,"ref_gather_node_metric_solb",(ulong)uVar5,"node local failed");
                    uStackY_e0 = (ulong)uVar5;
                  }
                  if (uVar5 == 5) {
LAB_00134981:
                    for (lVar11 = 0; lVar11 != 7; lVar11 = lVar11 + 1) {
                      *(undefined8 *)((long)pvVar20 + lVar11 * 8) = 0;
                    }
                  }
                  else {
                    if (uVar5 != 0) {
                      if ((int)uStackY_e0 != 0) goto LAB_00134f85;
                      goto LAB_00135071;
                    }
                    if (pRVar2->id != pRVar1->part[local]) goto LAB_00134981;
                    pRVar23 = (REF_DBL *)(uVar10 * 0x38 + (long)pvVar8);
                    uVar5 = ref_node_metric_get(pRVar1,local,pRVar23);
                    if (uVar5 != 0) {
                      pcVar21 = "get";
                      uVar16 = 0x5d1;
                      goto LAB_00134fe9;
                    }
                    pRVar23[6] = 1.0;
                  }
                  pvVar20 = (void *)((long)pvVar20 + 0x38);
                }
                uVar5 = ref_mpi_sum(pRVar2,pvVar8,pvVar9,iVar4 * 7,3);
                if (uVar5 != 0) {
                  pcVar21 = "sum";
                  uVar16 = 0x5d8;
LAB_00134fe9:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,uVar16,"ref_gather_node_metric_solb",(ulong)uVar5,pcVar21);
                  uStackY_e0 = (ulong)uVar5;
                  goto LAB_00134f85;
                }
                uVar10 = local_68 & 0xffffffff;
                if (pRVar2->id == 0) {
                  for (lVar11 = 0; uVar22 * 0x38 != lVar11; lVar11 = lVar11 + 0x38) {
                    dVar25 = *(double *)((long)pvVar9 + lVar11 + 0x30) + -1.0;
                    if (dVar25 <= -dVar25) {
                      dVar25 = -dVar25;
                    }
                    if (0.1 < dVar25) {
                      printf("error gather node %ld %f\n",local_90);
                    }
                    sVar12 = fwrite((void *)((long)pvVar9 + lVar11),8,1,__stream);
                    if (uVar15 == 3) {
                      if (sVar12 != 1) {
                        pcVar21 = "m11";
                        uStackY_e0 = 1;
                        uVar16 = 0x5e1;
                        goto LAB_00134f7a;
                      }
                      sVar12 = fwrite((void *)((long)pvVar9 + lVar11 + 8),8,1,__stream);
                      if (sVar12 != 1) {
                        pcVar21 = "m12";
                        uStackY_e0 = 1;
                        uVar16 = 0x5e2;
                        goto LAB_00134f7a;
                      }
                      sVar12 = fwrite((void *)((long)pvVar9 + lVar11 + 0x18),8,1,__stream);
                      if (sVar12 != 1) {
                        pcVar21 = "m22";
                        uStackY_e0 = 1;
                        uVar16 = 0x5e4;
                        goto LAB_00134f7a;
                      }
                      sVar12 = fwrite((void *)((long)pvVar9 + lVar11 + 0x10),8,1,__stream);
                      if (sVar12 != 1) {
                        pcVar21 = "m13";
                        uStackY_e0 = 1;
                        uVar16 = 0x5e5;
                        goto LAB_00134f7a;
                      }
                      sVar12 = fwrite((void *)((long)pvVar9 + lVar11 + 0x20),8,1,__stream);
                      if (sVar12 != 1) {
                        pcVar21 = "m23";
                        uStackY_e0 = 1;
                        uVar16 = 0x5e6;
                        goto LAB_00134f7a;
                      }
                      sVar12 = fwrite((void *)((long)pvVar9 + lVar11 + 0x28),8,1,__stream);
                      if (sVar12 != 1) {
                        pcVar21 = "m33";
                        uStackY_e0 = 1;
                        uVar16 = 0x5e7;
                        goto LAB_00134f7a;
                      }
                    }
                    else {
                      if (sVar12 != 1) {
                        pcVar21 = "m11";
                        uStackY_e0 = 1;
                        uVar16 = 0x5e9;
                        goto LAB_00134f7a;
                      }
                      sVar12 = fwrite((void *)((long)pvVar9 + lVar11 + 8),8,1,__stream);
                      if (sVar12 != 1) {
                        pcVar21 = "m12";
                        uStackY_e0 = 1;
                        uVar16 = 0x5ea;
                        goto LAB_00134f7a;
                      }
                      sVar12 = fwrite((void *)((long)pvVar9 + lVar11 + 0x18),8,1,__stream);
                      if (sVar12 != 1) {
                        pcVar21 = "m22";
                        uStackY_e0 = 1;
                        uVar16 = 0x5eb;
                        goto LAB_00134f7a;
                      }
                    }
                    local_90 = local_90 + 1;
                    uVar10 = local_68 & 0xffffffff;
                  }
                }
                local_90 = local_40;
                lVar11 = pRVar1->old_n_global;
              }
              free(pvVar9);
              free(pvVar8);
              if (pRVar2->id != 0) {
LAB_00135071:
                if (ref_grid->mpi->id != 0) {
                  return 0;
                }
                fclose(__stream);
                return 0;
              }
              sVar12 = ftell(__stream);
              if (sVar18 == sVar12) {
                if (pRVar2->id != 0) goto LAB_00135071;
                keyword_code = 0x36;
                sVar12 = fwrite(&keyword_code,4,1,__stream);
                if (sVar12 == 1) {
                  uVar3 = ref_export_meshb_next_position((FILE *)__stream,uVar3,0);
                  if (uVar3 == 0) goto LAB_00135071;
                  uStackY_e0 = (ulong)uVar3;
                  pcVar21 = "next p";
                  uVar16 = 0x5fa;
                  goto LAB_0013410b;
                }
                pcVar21 = "end kw";
                uStackY_e0 = 1;
                uVar16 = 0x5f8;
              }
              else {
                pcVar21 = "solb metric record len inconsistent";
                uVar16 = 0x5f4;
                uStackY_e0 = local_70;
              }
              goto LAB_00134f7a;
            }
            pcVar21 = "malloc xyzm of REF_DBL NULL";
            uVar16 = 0x5be;
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar16,"ref_gather_node_metric_solb",pcVar21);
          uStackY_e0 = 2;
          goto LAB_00134f85;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x5bd,"ref_gather_node_metric_solb","malloc local_xyzm of REF_DBL negative");
        goto LAB_00134f81;
      }
      lVar13 = pRVar1->old_n_global;
      lVar14 = ftell(__stream);
      keyword_code = 0x3e;
      sVar12 = fwrite(&keyword_code,4,1,__stream);
      if (sVar12 != 1) {
        pcVar21 = "vertex version code";
        uStackY_e0 = 1;
        uVar16 = 0x5af;
        goto LAB_00134f7a;
      }
      sVar18 = lVar14 + (ulong)((int)uVar10 + (uint)(bVar24 ^ 1) * 4) + lVar11 * lVar13 + 0xc;
      uVar15 = ref_export_meshb_next_position((FILE *)__stream,uVar3,sVar18);
      if (uVar15 == 0) {
        RVar6 = ref_gather_meshb_glob((FILE *)__stream,uVar3,pRVar1->old_n_global);
        if (RVar6 == 0) {
          keyword_code = 1;
          sVar12 = fwrite(&keyword_code,4,1,__stream);
          if (sVar12 == 1) {
            keyword_code = 3;
            sVar12 = fwrite(&keyword_code,4,1,__stream);
            if (sVar12 == 1) goto LAB_001347ab;
            pcVar21 = "metric solution";
            uStackY_e0 = 1;
            uVar16 = 0x5b6;
          }
          else {
            pcVar21 = "n solutions";
            uStackY_e0 = 1;
            uVar16 = 0x5b4;
          }
          goto LAB_00134f7a;
        }
        pcVar21 = "nnode";
        uStackY_e0 = 1;
        uVar16 = 0x5b2;
      }
      else {
        uStackY_e0 = (ulong)uVar15;
        pcVar21 = "next p";
        uVar16 = 0x5b0;
      }
LAB_0013410b:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar16,"ref_gather_node_metric_solb",uStackY_e0,pcVar21);
    }
    else {
      pcVar21 = "code";
      uStackY_e0 = 1;
      uVar16 = 0x59f;
LAB_00134f7a:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar16,"ref_gather_node_metric_solb",pcVar21,uStackY_e0,sVar12);
LAB_00134f81:
      uStackY_e0 = 1;
    }
LAB_00134f85:
    pcVar21 = "nodes";
    uVar16 = 0xbbe;
    goto LAB_00134fa6;
  }
  if (met_format == 0) {
    pRVar2 = pRVar1->ref_mpi;
    lVar11 = pRVar1->old_n_global;
    uVar3 = (int)(lVar11 / (long)pRVar2->n) + 1;
    uVar10 = 0x7fffffff;
    if (0 < pRVar2->reduce_byte_limit) {
      uVar10 = (ulong)(uint)pRVar2->reduce_byte_limit / 0x38;
    }
    if (((int)uVar3 < (int)uVar10) && (uVar10 = (ulong)uVar3, (int)uVar3 < 0)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x509,"ref_gather_node_metric","malloc local_xyzm of REF_DBL negative");
      uStackY_e0 = 1;
    }
    else {
      uVar22 = (ulong)(uint)((int)uVar10 * 7);
      sVar18 = uVar22 * 8;
      pvVar8 = malloc(sVar18);
      if (pvVar8 == (void *)0x0) {
        pcVar21 = "malloc local_xyzm of REF_DBL NULL";
        uVar16 = 0x509;
      }
      else {
        pvVar9 = malloc(sVar18);
        if (pvVar9 != (void *)0x0) {
          uVar17 = 0;
          local_68 = uVar10;
          local_48 = ref_grid;
          while (ref_grid = local_48, uVar7 = lVar11 - uVar17, uVar7 != 0 && (long)uVar17 <= lVar11)
          {
            uVar19 = uVar7 & 0xffffffff;
            if ((long)local_68 < (long)uVar7) {
              uVar19 = uVar10;
            }
            for (uVar7 = 0; uVar22 != uVar7; uVar7 = uVar7 + 1) {
              *(undefined8 *)((long)pvVar8 + uVar7 * 8) = 0;
            }
            iVar4 = (int)uVar19;
            local_60 = uVar17 + (long)iVar4;
            uVar7 = 0;
            if (0 < iVar4) {
              uVar7 = uVar19;
            }
            pvVar20 = pvVar8;
            for (uVar19 = 0; uVar19 != uVar7; uVar19 = uVar19 + 1) {
              uVar3 = ref_node_local(pRVar1,uVar19 + uVar17,&local);
              if ((uVar3 != 0) && (uVar3 != 5)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x519,"ref_gather_node_metric",(ulong)uVar3,"node local failed");
                uStackY_e0 = (ulong)uVar3;
              }
              if (uVar3 == 5) {
LAB_0013463a:
                for (lVar11 = 0; lVar11 != 7; lVar11 = lVar11 + 1) {
                  *(undefined8 *)((long)pvVar20 + lVar11 * 8) = 0;
                }
              }
              else {
                if (uVar3 != 0) {
                  ref_grid = local_48;
                  if ((int)uStackY_e0 != 0) goto LAB_00134e7f;
                  goto LAB_00135071;
                }
                if (pRVar2->id != pRVar1->part[local]) goto LAB_0013463a;
                pRVar23 = (REF_DBL *)(uVar19 * 0x38 + (long)pvVar8);
                uVar3 = ref_node_metric_get(pRVar1,local,pRVar23);
                if (uVar3 != 0) {
                  pcVar21 = "get";
                  uVar16 = 0x51c;
                  goto LAB_00134f3f;
                }
                pRVar23[6] = 1.0;
              }
              pvVar20 = (void *)((long)pvVar20 + 0x38);
            }
            uVar3 = ref_mpi_sum(pRVar2,pvVar8,pvVar9,iVar4 * 7,3);
            if (uVar3 != 0) {
              pcVar21 = "sum";
              uVar16 = 0x523;
LAB_00134f3f:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar16,"ref_gather_node_metric",(ulong)uVar3,pcVar21);
              uStackY_e0 = (ulong)uVar3;
              goto LAB_00134e7f;
            }
            if (pRVar2->id == 0) {
              for (lVar11 = 0; uVar7 * 0x38 - lVar11 != 0; lVar11 = lVar11 + 0x38) {
                dVar25 = *(double *)((long)pvVar9 + lVar11 + 0x30) + -1.0;
                if (dVar25 <= -dVar25) {
                  dVar25 = -dVar25;
                }
                if (0.1 < dVar25) {
                  printf("error gather node %ld %f\n",uVar17);
                }
                fprintf(__stream,"%.15e %.15e %.15e %.15e %.15e %.15e \n",
                        *(undefined8 *)((long)pvVar9 + lVar11),
                        *(undefined8 *)((long)pvVar9 + lVar11 + 8),
                        *(undefined8 *)((long)pvVar9 + lVar11 + 0x10),
                        *(undefined8 *)((long)pvVar9 + lVar11 + 0x18),
                        *(undefined8 *)((long)pvVar9 + lVar11 + 0x20),
                        *(undefined8 *)((long)pvVar9 + lVar11 + 0x28));
                uVar17 = uVar17 + 1;
              }
            }
            uVar17 = local_60;
            lVar11 = pRVar1->old_n_global;
          }
          free(pvVar9);
LAB_0013506c:
          free(pvVar8);
          goto LAB_00135071;
        }
        pcVar21 = "malloc xyzm of REF_DBL NULL";
        uVar16 = 0x50a;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar16,"ref_gather_node_metric",pcVar21);
      uStackY_e0 = 2;
    }
LAB_00134e7f:
    pcVar21 = "nodes";
    uVar16 = 0xbc2;
    goto LAB_00134fa6;
  }
  if (ref_grid->twod == 0) {
    pcVar21 = "only implemented for twod mesh";
    uVar16 = 0x541;
LAB_00134ddf:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar16
           ,"ref_gather_node_bamg_met",pcVar21);
    uStackY_e0 = 1;
  }
  else {
    pRVar2 = ref_grid->mpi;
    pRVar1 = ref_grid->node;
    if (pRVar2->id == 0) {
      fprintf(__stream,"%ld %d\n",pRVar1->old_n_global,3);
    }
    lVar11 = pRVar1->old_n_global;
    uVar15 = (int)(lVar11 / (long)pRVar2->n) + 1;
    uVar3 = 0x7fffffff;
    if (0 < pRVar2->reduce_byte_limit) {
      uVar3 = (uint)pRVar2->reduce_byte_limit / 0x38;
    }
    if (((int)uVar15 < (int)uVar3) && (uVar3 = uVar15, (int)uVar15 < 0)) {
      pcVar21 = "malloc local_xyzm of REF_DBL negative";
      uVar16 = 0x54b;
      goto LAB_00134ddf;
    }
    local_60 = (ulong)(uVar3 * 7);
    sVar18 = local_60 * 8;
    pvVar8 = malloc(sVar18);
    if (pvVar8 == (void *)0x0) {
      pcVar21 = "malloc local_xyzm of REF_DBL NULL";
      uVar16 = 0x54b;
    }
    else {
      pvVar9 = malloc(sVar18);
      if (pvVar9 != (void *)0x0) {
        local_50 = (ulong)uVar3;
        uVar10 = 0;
        while (uVar22 = lVar11 - uVar10, uVar22 != 0 && (long)uVar10 <= lVar11) {
          uVar17 = uVar22 & 0xffffffff;
          if ((long)local_50 < (long)uVar22) {
            uVar17 = (ulong)uVar3;
          }
          for (uVar22 = 0; local_60 != uVar22; uVar22 = uVar22 + 1) {
            *(undefined8 *)((long)pvVar8 + uVar22 * 8) = 0;
          }
          iVar4 = (int)uVar17;
          local_68 = uVar10 + (long)iVar4;
          uVar22 = 0;
          if (0 < iVar4) {
            uVar22 = uVar17;
          }
          pvVar20 = pvVar8;
          for (uVar17 = 0; uVar17 != uVar22; uVar17 = uVar17 + 1) {
            uVar15 = ref_node_local(pRVar1,uVar10 + uVar17,&local);
            if ((uVar15 != 0) && (uVar15 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x55b,"ref_gather_node_bamg_met",(ulong)uVar15,"node local failed");
              uStackY_e0 = (ulong)uVar15;
            }
            if (uVar15 == 5) {
LAB_00134337:
              for (lVar11 = 0; lVar11 != 7; lVar11 = lVar11 + 1) {
                *(undefined8 *)((long)pvVar20 + lVar11 * 8) = 0;
              }
            }
            else {
              if (uVar15 != 0) {
                if ((int)uStackY_e0 != 0) goto LAB_00134dea;
                goto LAB_00135071;
              }
              if (pRVar2->id != pRVar1->part[local]) goto LAB_00134337;
              pRVar23 = (REF_DBL *)(uVar17 * 0x38 + (long)pvVar8);
              uVar15 = ref_node_metric_get(pRVar1,local,pRVar23);
              if (uVar15 != 0) {
                pcVar21 = "get";
                uVar16 = 0x55e;
                goto LAB_00134f09;
              }
              pRVar23[6] = 1.0;
            }
            pvVar20 = (void *)((long)pvVar20 + 0x38);
          }
          uVar15 = ref_mpi_sum(pRVar2,pvVar8,pvVar9,iVar4 * 7,3);
          if (uVar15 != 0) {
            pcVar21 = "sum";
            uVar16 = 0x565;
LAB_00134f09:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar16,"ref_gather_node_bamg_met",(ulong)uVar15,pcVar21);
            uStackY_e0 = (ulong)uVar15;
            goto LAB_00134dea;
          }
          if (pRVar2->id == 0) {
            for (lVar11 = 0; uVar22 * 0x38 - lVar11 != 0; lVar11 = lVar11 + 0x38) {
              dVar25 = *(double *)((long)pvVar9 + lVar11 + 0x30) + -1.0;
              if (dVar25 <= -dVar25) {
                dVar25 = -dVar25;
              }
              if (0.1 < dVar25) {
                printf("error gather node %ld %f\n",uVar10);
              }
              fprintf(__stream,"%.15e %.15e %.15e\n",*(undefined8 *)((long)pvVar9 + lVar11),
                      *(undefined8 *)((long)pvVar9 + lVar11 + 8),
                      *(undefined8 *)((long)pvVar9 + lVar11 + 0x18));
              uVar10 = uVar10 + 1;
            }
          }
          uVar10 = local_68;
          lVar11 = pRVar1->old_n_global;
        }
        free(pvVar9);
        goto LAB_0013506c;
      }
      pcVar21 = "malloc xyzm of REF_DBL NULL";
      uVar16 = 0x54c;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar16
           ,"ref_gather_node_bamg_met",pcVar21);
    uStackY_e0 = 2;
  }
LAB_00134dea:
  pcVar21 = "nodes";
  uVar16 = 0xbc0;
LAB_00134fa6:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar16,
         "ref_gather_metric",uStackY_e0 & 0xffffffff,pcVar21);
  return (REF_STATUS)uStackY_e0;
}

Assistant:

REF_FCN REF_STATUS ref_gather_metric(REF_GRID ref_grid, const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  size_t end_of_string;
  REF_BOOL solb_format = REF_FALSE;
  REF_BOOL met_format = REF_FALSE;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    end_of_string = strlen(filename);
    if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".solb") == 0)
      solb_format = REF_TRUE;
    if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".met") == 0)
      met_format = REF_TRUE;
  }
  RSS(ref_mpi_all_or(ref_grid_mpi(ref_grid), &solb_format), "bcast");
  RSS(ref_mpi_all_or(ref_grid_mpi(ref_grid), &met_format), "bcast");

  if (solb_format) {
    RSS(ref_gather_node_metric_solb(ref_grid, file), "nodes");
  } else if (met_format) {
    RSS(ref_gather_node_bamg_met(ref_grid, file), "nodes");
  } else {
    RSS(ref_gather_node_metric(ref_node, file), "nodes");
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}